

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

void reset_ts(TCGTemp *ts)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  
  puVar1 = (undefined1 *)ts->state_ptr;
  lVar2 = *(long *)(puVar1 + 0x10);
  lVar3 = *(long *)(*(long *)(puVar1 + 8) + 0x30);
  *(long *)(*(long *)(lVar2 + 0x30) + 8) = *(long *)(puVar1 + 8);
  *(long *)(lVar3 + 0x10) = lVar2;
  *(TCGTemp **)(puVar1 + 0x10) = ts;
  *(TCGTemp **)(puVar1 + 8) = ts;
  *puVar1 = 0;
  *(undefined8 *)(puVar1 + 0x20) = 0xffffffffffffffff;
  return;
}

Assistant:

static void reset_ts(TCGTemp *ts)
{
    struct tcg_temp_info *ti = ts_info(ts);
    struct tcg_temp_info *pi = ts_info(ti->prev_copy);
    struct tcg_temp_info *ni = ts_info(ti->next_copy);

    ni->prev_copy = ti->prev_copy;
    pi->next_copy = ti->next_copy;
    ti->next_copy = ts;
    ti->prev_copy = ts;
    ti->is_const = false;
    ti->mask = -1;
}